

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

NULLCAutoArray *
NULLCTypeInfo::GetArrayByType(NULLCAutoArray *__return_storage_ptr__,TypeID id,uint size)

{
  NULLCArray NVar1;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  if (id.typeID != 0) {
    NVar1 = nullcAllocateArrayTyped(id.typeID,size);
    __return_storage_ptr__->len = size;
    __return_storage_ptr__->typeID = id.typeID;
    __return_storage_ptr__->ptr = NVar1.ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCAutoArray GetArrayByType(TypeID id, unsigned size)
	{
		NULLCAutoArray r = { 0, 0, 0 };

		if(!id.typeID)
			return r;

		NULLCArray arr = nullcAllocateArrayTyped(id.typeID, size);
		r.len = size;
		r.typeID = id.typeID;
		r.ptr = arr.ptr;
		return r;
	}